

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp.h
# Opt level: O0

void dts_consume(DataTransferStatsDirection *s,unsigned_long size_consumed)

{
  unsigned_long size_consumed_local;
  DataTransferStatsDirection *s_local;
  
  if ((s->running & 1U) != 0) {
    if (size_consumed < s->remaining) {
      s->remaining = s->remaining - size_consumed;
    }
    else {
      s->running = false;
      s->expired = true;
    }
  }
  return;
}

Assistant:

static inline void dts_consume(struct DataTransferStatsDirection *s,
                               unsigned long size_consumed)
{
    if (s->running) {
        if (s->remaining <= size_consumed) {
            s->running = false;
            s->expired = true;
        } else {
            s->remaining -= size_consumed;
        }
    }
}